

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell_union.cc
# Opt level: O3

S2Cap * __thiscall S2CellUnion::GetCapBound(S2Cap *__return_storage_ptr__,S2CellUnion *this)

{
  double dVar1;
  double dVar2;
  pointer pSVar3;
  ulong uVar4;
  long lVar5;
  double *ap;
  pointer pSVar6;
  bool bVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  S2CellId id;
  undefined1 local_d8 [16];
  double local_c8;
  double local_c0;
  undefined1 local_b8 [8];
  ostream *poStack_b0;
  double local_a8;
  double local_78;
  double local_68;
  double dStack_60;
  S2Cap local_58;
  
  pSVar6 = (this->cell_ids_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
           super__Vector_impl_data._M_start;
  pSVar3 = (this->cell_ids_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pSVar6 == pSVar3) {
    (__return_storage_ptr__->super_S2Region)._vptr_S2Region = (_func_int **)&PTR__S2Region_002bb758;
    (__return_storage_ptr__->center_).c_[0] = 1.0;
    (__return_storage_ptr__->center_).c_[1] = 0.0;
    (__return_storage_ptr__->center_).c_[2] = 0.0;
    S1ChordAngle::S1ChordAngle(&__return_storage_ptr__->radius_,-1.0);
  }
  else {
    dVar9 = 0.0;
    dVar10 = 0.0;
    dVar8 = 0.0;
    do {
      local_58.super_S2Region._vptr_S2Region = (_func_int **)pSVar6->id_;
      if (local_58.super_S2Region._vptr_S2Region == (_func_int **)0x0) {
        S2LogMessage::S2LogMessage
                  ((S2LogMessage *)local_b8,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cell_id.h"
                   ,0x223,kFatal,(ostream *)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poStack_b0,"Check failed: id_ != 0 ",0x17);
        goto LAB_001dc683;
      }
      uVar4 = 0;
      if (local_58.super_S2Region._vptr_S2Region != (_func_int **)0x0) {
        for (; ((ulong)local_58.super_S2Region._vptr_S2Region >> uVar4 & 1) == 0; uVar4 = uVar4 + 1)
        {
        }
      }
      local_c0 = dVar8;
      local_68 = dVar9;
      dStack_60 = dVar10;
      local_78 = S2Cell::AverageArea(0x1e - ((uint)(uVar4 >> 1) & 0x7fffffff));
      S2CellId::ToPoint((S2Point *)local_b8,(S2CellId *)&local_58);
      dVar9 = local_68 + local_78 * (double)local_b8;
      dVar10 = dStack_60 + local_78 * (double)poStack_b0;
      dVar8 = local_c0 + local_78 * local_a8;
      pSVar6 = pSVar6 + 1;
    } while (pSVar6 != pSVar3);
    local_d8._8_8_ = dVar10;
    local_d8._0_8_ = dVar9;
    local_c8 = dVar8;
    local_b8 = (undefined1  [8])0x0;
    poStack_b0 = (ostream *)0x0;
    local_a8 = 0.0;
    lVar5 = 0;
    do {
      dVar1 = *(double *)(local_d8 + lVar5);
      dVar2 = *(double *)(local_b8 + lVar5);
      if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) break;
      bVar7 = lVar5 != 0x10;
      lVar5 = lVar5 + 8;
    } while (bVar7);
    if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
      dVar1 = SQRT(dVar8 * dVar8 + dVar10 * dVar10 + dVar9 * dVar9);
      dVar1 = (double)(~-(ulong)(dVar1 != 0.0) & (ulong)dVar1 |
                      (ulong)(1.0 / dVar1) & -(ulong)(dVar1 != 0.0));
      dVar9 = dVar1 * dVar9;
      dVar10 = dVar1 * dVar10;
      local_c8 = dVar1 * dVar8;
    }
    else {
      dVar9 = 1.0;
      dVar10 = 0.0;
      local_c8 = 0.0;
    }
    local_d8._8_4_ = SUB84(dVar10,0);
    local_d8._0_8_ = dVar9;
    local_d8._12_4_ = (int)((ulong)dVar10 >> 0x20);
    S1ChordAngle::S1ChordAngle(&__return_storage_ptr__->radius_,0.0);
    (__return_storage_ptr__->super_S2Region)._vptr_S2Region = (_func_int **)&PTR__S2Region_002bb758;
    (__return_storage_ptr__->center_).c_[0] = (VType)local_d8._0_8_;
    (__return_storage_ptr__->center_).c_[1] = (VType)local_d8._8_8_;
    (__return_storage_ptr__->center_).c_[2] = local_c8;
    bVar7 = S2::IsUnitLength(&__return_storage_ptr__->center_);
    if ((!bVar7) || (4.0 < (__return_storage_ptr__->radius_).length2_)) {
      S2LogMessage::S2LogMessage
                ((S2LogMessage *)local_b8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cap.h"
                 ,0xf5,kFatal,(ostream *)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>
                (poStack_b0,"Check failed: is_valid() ",0x19);
LAB_001dc683:
      abort();
    }
    pSVar6 = (this->cell_ids_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
             super__Vector_impl_data._M_start;
    pSVar3 = (this->cell_ids_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pSVar6 != pSVar3) {
      do {
        S2Cell::S2Cell((S2Cell *)local_b8,(S2CellId)pSVar6->id_);
        S2Cell::GetCapBound(&local_58,(S2Cell *)local_b8);
        S2Cap::AddCap(__return_storage_ptr__,&local_58);
        pSVar6 = pSVar6 + 1;
      } while (pSVar6 != pSVar3);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

S2Cap S2CellUnion::GetCapBound() const {
  // Compute the approximate centroid of the region.  This won't produce the
  // bounding cap of minimal area, but it should be close enough.
  if (cell_ids_.empty()) return S2Cap::Empty();
  S2Point centroid(0, 0, 0);
  for (S2CellId id : *this) {
    double area = S2Cell::AverageArea(id.level());
    centroid += area * id.ToPoint();
  }
  if (centroid == S2Point(0, 0, 0)) {
    centroid = S2Point(1, 0, 0);
  } else {
    centroid = centroid.Normalize();
  }

  // Use the centroid as the cap axis, and expand the cap angle so that it
  // contains the bounding caps of all the individual cells.  Note that it is
  // *not* sufficient to just bound all the cell vertices because the bounding
  // cap may be concave (i.e. cover more than one hemisphere).
  S2Cap cap = S2Cap::FromPoint(centroid);
  for (S2CellId id : *this) {
    cap.AddCap(S2Cell(id).GetCapBound());
  }
  return cap;
}